

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetItemDefaultFocus(void)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImGuiWindow *window;
  ImGuiContext *pIVar3;
  ImGuiContext *g;
  float fVar4;
  float fVar5;
  
  pIVar3 = GImGui;
  window = GImGui->CurrentWindow;
  if ((((window->Appearing == true) && (GImGui->NavWindow == window->RootWindowForNav)) &&
      ((GImGui->NavInitRequest != false || (GImGui->NavInitResultId != 0)))) &&
     (GImGui->NavLayer == (window->DC).NavLayerCurrent)) {
    GImGui->NavInitRequest = false;
    pIVar3->NavInitResultId = (pIVar3->LastItemData).ID;
    IVar1 = (window->DC).CursorStartPos;
    IVar2 = (pIVar3->LastItemData).Rect.Min;
    fVar4 = IVar1.x;
    fVar5 = IVar1.y;
    IVar1 = (pIVar3->LastItemData).Rect.Max;
    (pIVar3->NavInitResultRectRel).Min.x = IVar2.x - fVar4;
    (pIVar3->NavInitResultRectRel).Min.y = IVar2.y - fVar5;
    (pIVar3->NavInitResultRectRel).Max.x = IVar1.x - fVar4;
    (pIVar3->NavInitResultRectRel).Max.y = IVar1.y - fVar5;
    pIVar3->NavAnyRequest = pIVar3->NavMoveScoringItems;
    if (((pIVar3->LastItemData).StatusFlags & 0x200) == 0) {
      ScrollToRectEx(window,&(pIVar3->LastItemData).Rect,0);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::SetItemDefaultFocus()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (!window->Appearing)
        return;
    if (g.NavWindow != window->RootWindowForNav || (!g.NavInitRequest && g.NavInitResultId == 0) || g.NavLayer != window->DC.NavLayerCurrent)
        return;

    g.NavInitRequest = false;
    g.NavInitResultId = g.LastItemData.ID;
    g.NavInitResultRectRel = WindowRectAbsToRel(window, g.LastItemData.Rect);
    NavUpdateAnyRequestFlag();

    // Scroll could be done in NavInitRequestApplyResult() via an opt-in flag (we however don't want regular init requests to scroll)
    if (!IsItemVisible())
        ScrollToRectEx(window, g.LastItemData.Rect, ImGuiScrollFlags_None);
}